

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.cpp
# Opt level: O0

char * uv11::inet_ntop(int __af,void *__cp,char *__buf,socklen_t __len)

{
  int s_00;
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  error_code eVar4;
  size_type r;
  int s;
  string *dst_local;
  void *src_local;
  int af_local;
  
  std::__cxx11::string::clear();
  std::__cxx11::string::resize((ulong)__buf,'-');
  uVar1 = std::__cxx11::string::front();
  uVar2 = std::__cxx11::string::size();
  s_00 = uv_inet_ntop(__af,__cp,uVar1,uVar2);
  if (s_00 == 0) {
    lVar3 = std::__cxx11::string::find((char)__buf,0);
    if (lVar3 == -1) {
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::resize((ulong)__buf);
    }
  }
  else {
    std::__cxx11::string::clear();
  }
  eVar4 = make_error(s_00);
  return (char *)(ulong)(uint)eVar4._M_value;
}

Assistant:

Error uv11::inet_ntop(int af, const void* src, std::string& dst) {
    dst.clear();
    dst.resize(45, 0);

    int s = ::uv_inet_ntop(af, src, &dst.front(), dst.size());

    if (s) {
        dst.clear();
    } else {
        auto r = dst.find('\0');
        if (r == dst.npos) {
            dst.clear();
        } else {
            dst.resize(r);
        }
    }

    return make_error(s);
}